

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

IVec3 __thiscall
deqp::gles31::Functional::anon_unknown_0::getTexelBlockStride
          (anon_unknown_0 *this,ImageInfo *info,int level)

{
  byte bVar1;
  int i;
  int iVar2;
  int i_1;
  long lVar3;
  IVec3 IVar4;
  IVec3 size;
  IVec3 textureTexelBlockSize;
  IVec3 texelBlockPixelSize;
  int local_40 [4];
  int local_30 [3];
  anon_unknown_0 local_24 [12];
  
  bVar1 = (byte)level;
  local_40[2] = 0;
  local_40[0] = 0;
  local_40[1] = 0;
  if (info->m_target == 0x8c1a) {
    local_40[0] = (info->m_size).m_data[0] >> (bVar1 & 0x1f);
    if (local_40[0] < 2) {
      local_40[0] = 1;
    }
    local_40[1] = (info->m_size).m_data[1] >> (bVar1 & 0x1f);
    if (local_40[1] < 2) {
      local_40[1] = 1;
    }
    local_40[2] = (info->m_size).m_data[2];
  }
  else {
    lVar3 = 0;
    do {
      iVar2 = (info->m_size).m_data[lVar3] >> (bVar1 & 0x1f);
      if (iVar2 < 2) {
        iVar2 = 1;
      }
      local_40[lVar3] = iVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
  }
  iVar2 = getTexelBlockSize(info->m_format);
  getTexelBlockPixelSize(local_24,info->m_format);
  local_30[0] = 0;
  local_30[1] = 0;
  lVar3 = 0;
  do {
    IVar4.m_data[2] = local_40[lVar3] % *(int *)(local_24 + lVar3 * 4);
    local_30[lVar3] =
         (local_40[lVar3] / *(int *)(local_24 + lVar3 * 4) + 1) - (uint)(IVar4.m_data[2] == 0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  IVar4.m_data[0] = local_30[0] * iVar2;
  IVar4.m_data[1] = 0;
  *(int *)this = iVar2;
  *(uint *)(this + 4) = IVar4.m_data[0];
  *(uint *)(this + 8) = local_30[1] * IVar4.m_data[0];
  return (IVec3)IVar4.m_data;
}

Assistant:

IVec3 getTexelBlockStride (const ImageInfo& info, int level)
{
	const IVec3	size					= getLevelSize(info.getTarget(), info.getSize(), level);
	const int	texelBlockSize			= getTexelBlockSize(info.getFormat());
	const IVec3 texelBlockPixelSize		= getTexelBlockPixelSize(info.getFormat());
	const IVec3 textureTexelBlockSize	= divRoundUp(size, texelBlockPixelSize);

	return IVec3(texelBlockSize, textureTexelBlockSize.x() * texelBlockSize, textureTexelBlockSize.x() * textureTexelBlockSize.y() * texelBlockSize);
}